

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSteerDemo.cpp
# Opt level: O2

void OpenSteer::OpenSteerDemo::position2dCamera
               (AbstractVehicle *selected,float distance,float elevation)

{
  position3dCamera(selected,distance,elevation);
  camera.super_LocalSpace._position.y = camera.super_LocalSpace._position.y + elevation;
  return;
}

Assistant:

void 
OpenSteer::OpenSteerDemo::position2dCamera (AbstractVehicle& selected,
                                            float distance,
                                            float elevation)
{
    // position the camera as if in 3d:
    position3dCamera (selected, distance, elevation);

    // then adjust for 3d:
    Vec3 position3d = camera.position();
    position3d.y += elevation;
    camera.setPosition (position3d);
}